

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

void __thiscall sensors_analytics::DefaultConsumer::Close(DefaultConsumer *this)

{
  pthread_mutex_t *__mutex;
  HttpSender *this_00;
  
  __mutex = &this->records_mutex_;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  LoadRecordFromDisk(this);
  DumpRecordToDisk(this);
  this_00 = this->sender_;
  if (this_00 != (HttpSender *)0x0) {
    HttpSender::~HttpSender(this_00);
    operator_delete(this_00);
    this->sender_ = (HttpSender *)0x0;
  }
  pthread_mutex_destroy((pthread_mutex_t *)&this->sending_mutex_);
  pthread_mutex_destroy((pthread_mutex_t *)__mutex);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void DefaultConsumer::Close() {
  LockGuard records_lock(&records_mutex_);
  LoadRecordFromDisk();
  DumpRecordToDisk();
  if (sender_ != NULL) {
    delete sender_;
    sender_ = NULL;
  }
  SA_MUTEX_DESTROY(&sending_mutex_);
  SA_MUTEX_DESTROY(&records_mutex_);
}